

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_bitset_container_intersection_cardinality
              (array_container_t *src_1,bitset_container_t *src_2)

{
  int iVar1;
  _Bool _Var2;
  int local_24;
  uint16_t key;
  int i;
  int32_t origcard;
  int32_t newcard;
  bitset_container_t *src_2_local;
  array_container_t *src_1_local;
  
  i = 0;
  iVar1 = src_1->cardinality;
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    _Var2 = bitset_container_contains(src_2,src_1->array[local_24]);
    i = (uint)_Var2 + i;
  }
  return i;
}

Assistant:

int array_bitset_container_intersection_cardinality(
    const array_container_t *src_1, const bitset_container_t *src_2) {
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        newcard += bitset_container_contains(src_2, key);
    }
    return newcard;
}